

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::flipAllBitsSlowCase(APInt *this)

{
  uint uVar1;
  uint64_t *puVar2;
  APInt *pAVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar2 = (this->U).pVal;
  uVar1 = this->BitWidth;
  uVar4 = (ulong)uVar1 + 0x3f >> 6;
  if ((ulong)uVar1 != 0) {
    uVar5 = 0;
    do {
      puVar2[uVar5] = ~puVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    puVar2 = (this->U).pVal;
  }
  pAVar3 = (APInt *)(puVar2 + ((int)uVar4 - 1));
  if (uVar1 < 0x41) {
    pAVar3 = this;
  }
  (pAVar3->U).VAL = ((pAVar3->U).VAL << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  return;
}

Assistant:

void APInt::flipAllBitsSlowCase() {
  tcComplement(U.pVal, getNumWords());
  clearUnusedBits();
}